

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

void borg_send_inscribe(wchar_t i,char *str)

{
  char *local_20;
  char *s;
  char *str_local;
  wchar_t i_local;
  
  borg_keypress(0x7b);
  local_20 = str;
  if (i < (int)(uint)z_info->pack_size) {
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i]);
  }
  else {
    if (borg_items->iqty != '\0') {
      borg_keypress(0x2f);
    }
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                       [i - (uint)z_info->pack_size]);
  }
  for (; *local_20 != '\0'; local_20 = local_20 + 1) {
    borg_keypress((int)*local_20);
  }
  borg_keypress(0x9c);
  return;
}

Assistant:

void borg_send_inscribe(int i, char* str)
{
    char* s;

    /* Label it */
    borg_keypress('{');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        /* Go to equipment (if necessary) */
        if (borg_items[0].iqty)
            borg_keypress('/');

        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);
    }

    /* Send the label */
    for (s = str; *s; s++)
        borg_keypress(*s);

    /* End the inscription */
    borg_keypress(KC_ENTER);
}